

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_main.c
# Opt level: O0

void main_free(GlobalConfig *config)

{
  GlobalConfig *config_local;
  
  curl_easy_cleanup(config->easy);
  config->easy = (CURL *)0x0;
  curl_global_cleanup();
  free_config_fields(config);
  config_free(config->last);
  config->first = (OperationConfig *)0x0;
  config->last = (OperationConfig *)0x0;
  return;
}

Assistant:

static void main_free(struct GlobalConfig *config)
{
  /* Cleanup the easy handle */
  curl_easy_cleanup(config->easy);
  config->easy = NULL;

  /* Main cleanup */
  curl_global_cleanup();
  convert_cleanup();
  metalink_cleanup();
#ifdef USE_NSS
  if(PR_Initialized()) {
    /* prevent valgrind from reporting still reachable mem from NSRP arenas */
    PL_ArenaFinish();
    /* prevent valgrind from reporting possibly lost memory (fd cache, ...) */
    PR_Cleanup();
  }
#endif
  free_config_fields(config);

  /* Free the config structures */
  config_free(config->last);
  config->first = NULL;
  config->last = NULL;
}